

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O2

void __thiscall TNT::Array2D<interval>::Array2D(Array2D<interval> *this,int m,int n)

{
  interval *piVar1;
  ulong uVar2;
  
  Array1D<interval>::Array1D(&this->data_,n * m);
  Array1D<interval_*>::Array1D(&this->v_,m);
  this->m_ = m;
  this->n_ = n;
  if (0 < n && 0 < m) {
    piVar1 = (this->data_).data_;
    for (uVar2 = 0; (uint)m != uVar2; uVar2 = uVar2 + 1) {
      (this->v_).data_[uVar2] = piVar1;
      piVar1 = piVar1 + (uint)n;
    }
  }
  return;
}

Assistant:

Array2D<T>::Array2D(int m, int n) : data_(m*n), v_(m), m_(m), n_(n)
{
	if (m>0 && n>0)
	{
		T* p = &(data_[0]);
		for (int i=0; i<m; i++)
		{
			v_[i] = p;
			p += n;
		}
	}
}